

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_GiveToChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *pAVar1;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *receiver;
  AActor *pAVar6;
  char *__assertion;
  VMReturn *in_R9;
  bool bVar7;
  TThinkerIterator<AActor> it;
  int in_stack_ffffffffffffffa8;
  FThinkerIterator local_48;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar1 = (AActor *)(param->field_0).field_1.a;
      if (pAVar1 != (AActor *)0x0) {
        if ((pAVar1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar1->super_DThinker).super_DObject._vptr_DObject)(pAVar1);
          (pAVar1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar5 = (pAVar1->super_DThinker).super_DObject.Class;
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003cf48b;
        }
      }
      FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
      receiver = (AActor *)FThinkerIterator::Next(&local_48,false);
      iVar3 = 0;
      if (receiver != (AActor *)0x0) {
        iVar3 = 0;
        do {
          pAVar6 = (receiver->master).field_0.p;
          if ((pAVar6 != (AActor *)0x0) &&
             (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (receiver->master).field_0.p = (AActor *)0x0;
            pAVar6 = (AActor *)0x0;
          }
          if (pAVar6 == pAVar1) {
            bVar7 = DoGiveInventory(receiver,true,param,defaultparam,numparam,in_R9,
                                    in_stack_ffffffffffffffa8);
            iVar3 = iVar3 + (uint)bVar7;
          }
          receiver = (AActor *)FThinkerIterator::Next(&local_48,false);
        } while (receiver != (AActor *)0x0);
      }
      iVar4 = 0;
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x993,
                        "int AF_AActor_A_GiveToChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(int *)ret->Location = iVar3;
        iVar4 = 1;
      }
      return iVar4;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003cf48b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x986,
                "int AF_AActor_A_GiveToChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveToChildren)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<AActor> it;
	AActor *mo;
	int count = 0;

	while ((mo = it.Next()))
	{
		if (mo->master == self)
		{
			count += DoGiveInventory(mo, true, VM_ARGS_NAMES);
		}
	}
	ACTION_RETURN_INT(count);
}